

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t flatcc_builder_end_string(flatcc_builder_t *B)

{
  uint uVar1;
  flatcc_builder_ref_t fVar2;
  
  if (B->frame->type != 6) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x6e9,"flatcc_builder_ref_t flatcc_builder_end_string(flatcc_builder_t *)");
  }
  uVar1 = (B->frame->container).table.pl_end;
  if (uVar1 == B->ds_offset) {
    fVar2 = flatcc_builder_create_string(B,(char *)B->ds,(ulong)uVar1);
    if (fVar2 != 0) {
      exit_frame(B);
    }
    return fVar2;
  }
  __assert_fail("frame(container.vector.count) == B->ds_offset",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x6ea,"flatcc_builder_ref_t flatcc_builder_end_string(flatcc_builder_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_string(flatcc_builder_t *B)
{
    flatcc_builder_ref_t string_ref;

    check(frame(type) == flatcc_builder_string, "expected string frame");
    FLATCC_ASSERT(frame(container.vector.count) == B->ds_offset);
    if (0 == (string_ref = flatcc_builder_create_string(B,
            (const char *)B->ds, B->ds_offset))) {
        return 0;
    }
    exit_frame(B);
    return string_ref;
}